

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_locale.cpp
# Opt level: O0

wchar_t * LocalWideStringBuider(char *cbuffer,wchar_t *buffer,size_t buffer_capacity)

{
  wchar_t wVar1;
  wchar_t *dest_end;
  wchar_t *dest;
  size_t buffer_capacity_local;
  wchar_t *buffer_local;
  char *cbuffer_local;
  
  if (((buffer_capacity == 0) || (buffer == (wchar_t *)0x0)) ||
     (memset(buffer,0,buffer_capacity << 2), cbuffer == (char *)0x0)) {
LAB_006b0b15:
    cbuffer_local = (char *)0x0;
  }
  else {
    dest_end = buffer;
    buffer_local = (wchar_t *)cbuffer;
    do {
      if (buffer + buffer_capacity <= dest_end) {
        memset(buffer,0,buffer_capacity << 2);
        goto LAB_006b0b15;
      }
      wVar1 = *buffer_local;
      *dest_end = (int)(char)wVar1;
      dest_end = dest_end + 1;
      buffer_local = (wchar_t *)((long)buffer_local + 1);
      cbuffer_local = (char *)buffer;
    } while ((char)wVar1 != L'\0');
  }
  return (wchar_t *)cbuffer_local;
}

Assistant:

static wchar_t* LocalWideStringBuider(
  const char* cbuffer,
  wchar_t* buffer,
  size_t buffer_capacity
  )
{
  if (buffer_capacity > 0 && nullptr != buffer)
  {
    memset(buffer, 0, buffer_capacity*sizeof(buffer[0]));
    if (nullptr != cbuffer)
    {
      wchar_t* dest = buffer;
      wchar_t* dest_end = dest + buffer_capacity;
      while (dest < dest_end)
      {
        if (0 == (*dest++ = (wchar_t)(*cbuffer++)))
          return buffer;
      }
      memset(buffer, 0, buffer_capacity*sizeof(buffer[0]));
    }
  }
  return nullptr;
}